

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

void bmp24toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  int iVar7;
  OPJ_UINT8 *pOVar8;
  OPJ_UINT32 OVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  poVar3 = image->comps;
  OVar1 = poVar3->h;
  if (OVar1 != 0) {
    uVar2 = poVar3->w;
    pOVar8 = pData + (OVar1 - 1) * stride;
    OVar9 = 0;
    iVar10 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        pOVar4 = poVar3->data;
        pOVar5 = poVar3[1].data;
        pOVar6 = poVar3[2].data;
        uVar12 = 0;
        uVar11 = 0;
        do {
          iVar7 = (int)uVar12;
          pOVar4[(long)iVar10 + uVar11] = (uint)pOVar8[iVar7 + 2];
          pOVar5[(long)iVar10 + uVar11] = (uint)pOVar8[iVar7 + 1];
          pOVar6[(long)iVar10 + uVar11] = (uint)pOVar8[uVar12];
          uVar11 = uVar11 + 1;
          uVar12 = (ulong)(iVar7 + 3);
        } while (uVar2 != uVar11);
        iVar10 = iVar10 + (int)uVar11;
      }
      pOVar8 = pOVar8 + -(ulong)stride;
      OVar9 = OVar9 + 1;
    } while (OVar9 != OVar1);
  }
  return;
}

Assistant:

static void bmp24toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                         opj_image_t* image)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            image->comps[0].data[index] = (OPJ_INT32)pSrc[3 * x + 2]; /* R */
            image->comps[1].data[index] = (OPJ_INT32)pSrc[3 * x + 1]; /* G */
            image->comps[2].data[index] = (OPJ_INT32)pSrc[3 * x + 0]; /* B */
            index++;
        }
        pSrc -= stride;
    }
}